

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sine.cpp
# Opt level: O1

void __thiscall chrono::ChFunction_Sine::ArchiveIN(ChFunction_Sine *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Sine>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30 = &this->amp;
  local_38 = "amp";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->phase;
  local_38 = "phase";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->freq;
  local_38 = "freq";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Sine::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Sine>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(amp);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(freq);
}